

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_down_sah_builder.h
# Opt level: O0

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  reference pvVar8;
  undefined4 extraout_var;
  const_reference pvVar9;
  reference pvVar10;
  undefined4 extraout_var_00;
  unsigned_long *puVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pair<unsigned_long,_unsigned_long> pVar12;
  undefined1 local_cc8 [8];
  WorkItem second_item;
  WorkItem first_item;
  pair<unsigned_long,_unsigned_long> second_range;
  pair<unsigned_long,_unsigned_long> first_range;
  BBox second_bbox;
  BBox first_bbox;
  size_type first_child;
  float local_c30;
  undefined8 local_c2c;
  _Storage<unsigned_long,_true> local_c20;
  optional<unsigned_long> split_pos;
  value_type *node;
  value_type item;
  undefined1 local_bd8 [8];
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
  stack;
  BBox<float,_3UL> bbox;
  size_type prim_count;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this_local;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh;
  float local_b2c;
  float fStack_b28;
  Vec<float,_3UL> d_1;
  anon_class_16_2_94731e0a local_a70;
  Vec<float,_3UL> *local_a60;
  float *local_a58;
  undefined8 local_a50;
  float local_a48;
  undefined8 local_a40;
  float local_a38;
  anon_class_16_2_94732099 local_a30;
  anon_class_16_2_94731e0a *local_a20;
  undefined1 local_a14 [8];
  Vec<float,_3UL> v_9;
  float local_9d4;
  float fStack_9d0;
  Vec<float,_3UL> d;
  anon_class_16_2_94731e0a local_918;
  float *local_908;
  float *local_900;
  undefined8 local_8f8;
  float local_8f0;
  undefined8 local_8e8;
  float local_8e0;
  anon_class_16_2_94732099 local_8d8;
  anon_class_16_2_94731e0a *local_8c8;
  undefined1 local_8bc [8];
  Vec<float,_3UL> v_8;
  anon_class_16_2_3fddf3e4 local_890;
  BBox<float,_3UL> *local_880;
  reference local_878;
  anon_class_16_2_3fddf3e4 local_870;
  BBox<float,_3UL> *local_860;
  reference local_858;
  anon_class_16_2_3fddf3e4 local_850;
  BBox<float,_3UL> *local_840;
  reference local_838;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_830;
  size_t i_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *prim_ids_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_818;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_810;
  float local_808 [2];
  float local_800;
  float local_7f4 [2];
  float local_7ec;
  undefined8 local_7e8;
  float local_7e0;
  undefined8 local_7d8;
  float local_7d0;
  reference local_7c8;
  Vec<float,_3UL> *local_7c0;
  undefined8 local_7b8;
  float local_7b0;
  undefined8 local_7a8;
  float local_7a0;
  anon_class_16_2_94731e0a local_798;
  reference local_788;
  Vec<float,_3UL> *local_780;
  undefined8 local_778;
  float local_770;
  float local_768 [2];
  float local_760;
  float local_758 [2];
  float local_750;
  anon_class_16_2_94731e0a local_748;
  Vec<float,_3UL> *local_738;
  float *local_730;
  float local_728 [2];
  float local_720;
  undefined8 local_718;
  float local_710;
  anon_class_16_2_94732099 local_708;
  anon_class_16_2_94731e0a *local_6f8;
  undefined1 local_6ec [8];
  Vec<float,_3UL> v_6;
  anon_class_16_2_94732099 local_6b0;
  anon_class_16_2_94731e0a *local_6a0;
  undefined1 local_694 [8];
  Vec<float,_3UL> v_7;
  float local_664 [2];
  float local_65c;
  undefined8 local_658;
  float local_650;
  float local_64c;
  float *local_648;
  float local_63c;
  float *local_638;
  float *local_630;
  undefined8 *local_628;
  undefined1 *local_620;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_618;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *prim_ids_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_600;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_5f8;
  float local_5f0 [2];
  float local_5e8;
  float local_5dc [2];
  float local_5d4;
  float local_5d0 [2];
  float local_5c8;
  float local_5c0 [2];
  float local_5b8;
  reference local_5b0;
  float *local_5a8;
  float local_5a0 [2];
  float local_598;
  float local_590 [2];
  float local_588;
  anon_class_16_2_94731e0a local_580;
  reference local_570;
  float *local_568;
  float local_560 [2];
  float local_558;
  float local_550 [2];
  float local_548;
  float local_540 [2];
  float local_538;
  anon_class_16_2_94731e0a local_530;
  Vec<float,_3UL> *local_520;
  float *local_518;
  float local_510 [2];
  float local_508;
  float local_500 [2];
  float local_4f8;
  anon_class_16_2_94732099 local_4f0;
  anon_class_16_2_94731e0a *local_4e0;
  undefined1 local_4d4 [8];
  Vec<float,_3UL> v_4;
  anon_class_16_2_94732099 local_498;
  anon_class_16_2_94731e0a *local_488;
  undefined1 local_47c [8];
  Vec<float,_3UL> v_5;
  float local_44c [2];
  float local_444;
  float local_440 [2];
  float local_438;
  float local_434;
  float *local_430;
  float local_424;
  float *local_420;
  float *local_418;
  float *local_410;
  float *local_408;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_400;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *prim_ids;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3e8;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_3e0;
  float local_3d8 [2];
  float local_3d0;
  float local_3c4 [2];
  float local_3bc;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  reference local_398;
  Vec<float,_3UL> *local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  anon_class_16_2_94731e0a local_368;
  reference local_358;
  Vec<float,_3UL> *local_350;
  undefined8 local_348;
  float local_340;
  float local_338 [2];
  float local_330;
  float local_328 [2];
  float local_320;
  anon_class_16_2_94731e0a local_318;
  Vec<float,_3UL> *local_308;
  float *local_300;
  float local_2f8 [2];
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  anon_class_16_2_94732099 local_2d8;
  anon_class_16_2_94731e0a *local_2c8;
  undefined1 local_2bc [8];
  Vec<float,_3UL> v;
  anon_class_16_2_94732099 local_280;
  anon_class_16_2_94731e0a *local_270;
  undefined1 local_264 [8];
  Vec<float,_3UL> v_1;
  float local_234 [2];
  float local_22c;
  undefined8 local_228;
  float local_220;
  float local_21c;
  float *local_218;
  float local_20c;
  float *local_208;
  float *local_200;
  undefined8 *local_1f8;
  undefined1 *local_1f0;
  value_type **local_1e8;
  undefined1 *local_1e0;
  size_t *local_1d8;
  value_type **local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  anon_class_8_1_8991fb9c local_1b8;
  undefined8 local_1ac;
  float local_1a4;
  size_type local_1a0;
  float local_198;
  anon_class_8_1_8991fb9c local_190;
  size_type local_188;
  float local_180;
  reference local_178;
  undefined8 *local_170;
  size_type *local_168;
  size_type *local_160;
  size_type local_158;
  Index<32UL,_4UL> local_14c;
  size_t local_148;
  size_t local_140;
  Index<32UL,_4UL> local_134;
  anon_class_16_2_3fddf3e4 *local_130;
  anon_class_16_2_3fddf3e4 *local_128;
  anon_class_16_2_3fddf3e4 *local_120;
  anon_class_16_2_3fddf3e4 *local_118;
  anon_class_16_2_3fddf3e4 *local_110;
  anon_class_16_2_3fddf3e4 *local_108;
  anon_class_16_2_3fddf3e4 *local_100;
  anon_class_16_2_3fddf3e4 *local_f8;
  anon_class_16_2_3fddf3e4 *local_f0;
  anon_class_16_2_3fddf3e4 *local_e8;
  anon_class_16_2_3fddf3e4 *local_e0;
  anon_class_16_2_3fddf3e4 *local_d8;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_d0;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_c8;
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_c0;
  ulong local_b8;
  float local_b0;
  anon_class_16_2_94732099 local_a8;
  anon_class_8_1_8991fb9c *local_98;
  undefined1 local_8c [8];
  Vec<float,_3UL> v_2;
  anon_class_16_2_94732099 local_70;
  anon_class_8_1_8991fb9c *local_60;
  undefined1 local_54 [8];
  Vec<float,_3UL> v_3;
  
  pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&this->bboxes_);
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Bvh(__return_storage_ptr__);
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::reserve(&__return_storage_ptr__->nodes,(ulong)((long)pvVar7 * 2) / this->config_->min_leaf_size)
  ;
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::emplace_back<>(&__return_storage_ptr__->nodes);
  pvVar8 = std::
           vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ::back(&__return_storage_ptr__->nodes);
  local_3e8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  prim_ids = pvVar7;
  local_3e0 = this;
  local_d0 = this;
  iVar6 = (**this->_vptr_TopDownSahBuilder)();
  i = CONCAT44(extraout_var,iVar6);
  local_20c = std::numeric_limits<float>::max();
  local_208 = (float *)&local_228;
  std::fill<float*,float>(local_208,&local_21c,&local_20c);
  local_21c = std::numeric_limits<float>::max();
  local_21c = -local_21c;
  local_218 = local_234;
  std::fill<float*,float>(local_218,(float *)&local_228,&local_21c);
  local_1f0 = (undefined1 *)
              ((long)&stack.c.
                      super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  local_1f8 = &local_228;
  local_200 = local_234;
  stack0xfffffffffffff47c = local_228;
  bbox.min.values[0] = local_220;
  bbox.min.values[1] = local_234[0];
  bbox.min.values[2] = local_234[1];
  bbox.max.values[0] = local_22c;
  for (local_400 = local_3e8; local_400 < prim_ids;
      local_400 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(local_400->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1)) {
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i,
                        (size_type)local_400);
    local_398 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::operator[]
                          (&this->bboxes_,*pvVar9);
    local_390 = (Vec<float,_3UL> *)
                ((long)&stack.c.
                        super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    local_2d8.f = &local_368;
    local_2d8.v = (Vec<float,_3UL> *)local_2bc;
    v.values._4_8_ = &local_2d8;
    local_368.a = local_390;
    local_368.b = &local_398->min;
    local_358 = local_398;
    local_350 = local_390;
    local_2c8 = local_2d8.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,0);
    uVar4 = v.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_2e0 = v.values[0];
    local_2e8 = local_2bc;
    local_370 = v.values[0];
    local_378 = local_2bc;
    local_340 = v.values[0];
    local_348 = local_2bc;
    local_380 = v.values[0];
    local_388 = local_2bc;
    local_3b0 = v.values[0];
    local_3b8 = local_2bc;
    local_3a0 = v.values[0];
    local_3a8 = local_2bc;
    bbox.min.values[0] = v.values[0];
    stack0xfffffffffffff47c = local_2bc;
    local_318.a = (Vec<float,_3UL> *)(bbox.min.values + 1);
    local_318.b = &local_398->max;
    local_280.f = &local_318;
    local_280.v = (Vec<float,_3UL> *)local_264;
    v_1.values._4_8_ = &local_280;
    local_308 = local_318.b;
    local_300 = (float *)local_318.a;
    local_270 = local_280.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,0);
    uVar4 = v_1.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_320 = v_1.values[0];
    local_328[0] = (float)local_264._0_4_;
    local_328[1] = (float)local_264._4_4_;
    local_2f0 = v_1.values[0];
    local_2f8[0] = (float)local_264._0_4_;
    local_2f8[1] = (float)local_264._4_4_;
    local_330 = v_1.values[0];
    local_338[0] = (float)local_264._0_4_;
    local_338[1] = (float)local_264._4_4_;
    local_3d0 = v_1.values[0];
    local_3d8[0] = (float)local_264._0_4_;
    local_3d8[1] = (float)local_264._4_4_;
    local_3c4[0] = (float)local_264._0_4_;
    local_3c4[1] = (float)local_264._4_4_;
    local_3bc = v_1.values[0];
    bbox.min.values[1] = (float)local_264._0_4_;
    bbox.min.values[2] = (float)local_264._4_4_;
    bbox.max.values[0] = v_1.values[0];
  }
  local_850.bbox =
       (BBox<float,_3UL> *)
       ((long)&stack.c.
               super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  local_130 = &local_850;
  local_850.this = pvVar8;
  local_840 = local_850.bbox;
  local_838 = pvVar8;
  Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_130,0);
  local_108 = local_130;
  Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_130,1);
  local_100 = local_108;
  Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_108,2);
  local_d8 = local_100;
  std::
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>>
  ::
  stack<std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>,void>
            ((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>>
              *)local_bd8);
  item.end = 0;
  std::
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
  ::push((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
          *)local_bd8,(value_type *)&item.end);
  do {
    while( true ) {
      bVar5 = std::
              stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
              ::empty((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
                       *)local_bd8);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        iVar6 = (**this->_vptr_TopDownSahBuilder)();
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&__return_storage_ptr__->prim_ids,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(extraout_var_03,iVar6));
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::shrink_to_fit(&__return_storage_ptr__->nodes);
        std::
        stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
        ::~stack((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
                  *)local_bd8);
        return __return_storage_ptr__;
      }
      pvVar10 = std::
                stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
                ::top((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
                       *)local_bd8);
      item.begin = pvVar10->end;
      node = (value_type *)pvVar10->node_id;
      item.node_id = pvVar10->begin;
      std::
      stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
      ::pop((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
             *)local_bd8);
      pvVar8 = std::
               vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ::operator[](&__return_storage_ptr__->nodes,(size_type)node);
      local_1d0 = &node;
      split_pos.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = pvVar8;
      if (this->config_->min_leaf_size < item.begin - item.node_id) break;
LAB_00110521:
      local_1e8 = &node;
      local_148 = item.begin - item.node_id;
      local_140 = item.node_id;
      if (local_148 == 0) {
        __assert_fail("prim_count != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                      ,0x41,
                      "static Index<Bits, PrimCountBits> bvh::v2::Index<32, 4>::make_leaf(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                     );
      }
      Index<32UL,_4UL>::Index(&local_134,item.node_id,local_148);
      *(Type *)(split_pos.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ + 0x18) = local_134.value;
    }
    local_a8.f = &local_190;
    local_a8.v = (Vec<float,_3UL> *)local_8c;
    v_3.values._4_8_ = &local_a8;
    local_190.this = pvVar8;
    local_178 = pvVar8;
    local_98 = local_a8.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,0);
    uVar4 = v_3.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_b0 = v_2.values[0];
    local_b8 = (ulong)local_8c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_8c;
    local_1a0 = vmovlpd_avx(auVar2);
    local_198 = v_2.values[0];
    local_180 = v_2.values[0];
    local_70.f = &local_1b8;
    local_70.v = (Vec<float,_3UL> *)local_54;
    local_1b8.this = pvVar8;
    local_188 = local_1a0;
    local_60 = local_70.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_70,0);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_70,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_70,2);
    v_2.values[1] = (float)local_54._0_4_;
    v_2.values[2] = (float)local_54._4_4_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_54;
    local_1c8 = vmovlpd_avx(auVar1);
    local_1c0 = v_3.values[0];
    local_1a4 = v_3.values[0];
    local_160 = &first_child;
    local_168 = &local_188;
    local_170 = &local_1ac;
    first_child = local_188;
    local_c30 = local_180;
    local_c2c = local_1ac;
    local_1ac = local_1c8;
    local_c20._0_4_ = (*this->_vptr_TopDownSahBuilder[1])(this,&first_child,item.node_id,item.begin)
    ;
    local_c20._M_value._4_4_ = extraout_var_00;
    bVar5 = std::optional::operator_cast_to_bool((optional *)&local_c20);
    if (!bVar5) goto LAB_00110521;
    register0x00000000 =
         std::
         vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ::size(&__return_storage_ptr__->nodes);
    local_158 = register0x00000000;
    Index<32UL,_4UL>::Index(&local_14c,register0x00000000,0);
    first_bbox.max.values[1] = (float)local_14c.value;
    *(Type *)(split_pos.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._8_8_ + 0x18) = local_14c.value;
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::resize(&__return_storage_ptr__->nodes,stack0xfffffffffffff3c0 + 2);
    sVar3 = item.node_id;
    puVar11 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_c20);
    prim_ids_1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*puVar11;
    local_600 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar3;
    local_5f8 = this;
    local_c8 = this;
    iVar6 = (**this->_vptr_TopDownSahBuilder)();
    i_1 = CONCAT44(extraout_var_01,iVar6);
    local_424 = std::numeric_limits<float>::max();
    local_420 = local_440;
    std::fill<float*,float>(local_420,&local_434,&local_424);
    local_434 = std::numeric_limits<float>::max();
    local_434 = -local_434;
    local_430 = local_44c;
    std::fill<float*,float>(local_430,local_440,&local_434);
    local_408 = second_bbox.max.values + 1;
    local_410 = local_440;
    local_418 = local_44c;
    second_bbox.max.values[1] = local_440[0];
    second_bbox.max.values[2] = local_440[1];
    first_bbox.min.values[0] = local_438;
    first_bbox.min.values[1] = local_44c[0];
    first_bbox.min.values[2] = local_44c[1];
    first_bbox.max.values[0] = local_444;
    for (local_618 = local_600; local_618 < prim_ids_1;
        local_618 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    ((long)&(local_618->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i_1,
                          (size_type)local_618);
      local_5b0 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::operator[]
                            (&this->bboxes_,*pvVar9);
      local_5a8 = second_bbox.max.values + 1;
      local_4f0.f = &local_580;
      local_4f0.v = (Vec<float,_3UL> *)local_4d4;
      v_4.values._4_8_ = &local_4f0;
      local_580.a = (Vec<float,_3UL> *)local_5a8;
      local_580.b = &local_5b0->min;
      local_570 = local_5b0;
      local_568 = local_5a8;
      local_4e0 = local_4f0.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,0);
      uVar4 = v_4.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
      local_4f8 = v_4.values[0];
      local_500[0] = (float)local_4d4._0_4_;
      local_500[1] = (float)local_4d4._4_4_;
      local_588 = v_4.values[0];
      local_590[0] = (float)local_4d4._0_4_;
      local_590[1] = (float)local_4d4._4_4_;
      local_558 = v_4.values[0];
      local_560[0] = (float)local_4d4._0_4_;
      local_560[1] = (float)local_4d4._4_4_;
      local_598 = v_4.values[0];
      local_5a0[0] = (float)local_4d4._0_4_;
      local_5a0[1] = (float)local_4d4._4_4_;
      local_5c8 = v_4.values[0];
      local_5d0[0] = (float)local_4d4._0_4_;
      local_5d0[1] = (float)local_4d4._4_4_;
      local_5b8 = v_4.values[0];
      local_5c0[0] = (float)local_4d4._0_4_;
      local_5c0[1] = (float)local_4d4._4_4_;
      first_bbox.min.values[0] = v_4.values[0];
      second_bbox.max.values[1] = (float)local_4d4._0_4_;
      second_bbox.max.values[2] = (float)local_4d4._4_4_;
      local_530.a = (Vec<float,_3UL> *)(first_bbox.min.values + 1);
      local_530.b = &local_5b0->max;
      local_498.f = &local_530;
      local_498.v = (Vec<float,_3UL> *)local_47c;
      v_5.values._4_8_ = &local_498;
      local_520 = local_530.b;
      local_518 = (float *)local_530.a;
      local_488 = local_498.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,0);
      uVar4 = v_5.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
      local_538 = v_5.values[0];
      local_540[0] = (float)local_47c._0_4_;
      local_540[1] = (float)local_47c._4_4_;
      local_508 = v_5.values[0];
      local_510[0] = (float)local_47c._0_4_;
      local_510[1] = (float)local_47c._4_4_;
      local_548 = v_5.values[0];
      local_550[0] = (float)local_47c._0_4_;
      local_550[1] = (float)local_47c._4_4_;
      local_5e8 = v_5.values[0];
      local_5f0[0] = (float)local_47c._0_4_;
      local_5f0[1] = (float)local_47c._4_4_;
      local_5dc[0] = (float)local_47c._0_4_;
      local_5dc[1] = (float)local_47c._4_4_;
      local_5d4 = v_5.values[0];
      first_bbox.min.values[1] = (float)local_47c._0_4_;
      first_bbox.min.values[2] = (float)local_47c._4_4_;
      first_bbox.max.values[0] = v_5.values[0];
    }
    puVar11 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_c20);
    local_818 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*puVar11;
    prim_ids_2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)item.begin;
    local_810 = this;
    local_c0 = this;
    iVar6 = (**this->_vptr_TopDownSahBuilder)();
    i_2 = CONCAT44(extraout_var_02,iVar6);
    local_63c = std::numeric_limits<float>::max();
    local_638 = (float *)&local_658;
    std::fill<float*,float>(local_638,&local_64c,&local_63c);
    local_64c = std::numeric_limits<float>::max();
    local_64c = -local_64c;
    local_648 = local_664;
    std::fill<float*,float>(local_648,(float *)&local_658,&local_64c);
    local_620 = (undefined1 *)((long)&first_range.second + 4);
    local_628 = &local_658;
    local_630 = local_664;
    stack0xfffffffffffff38c = local_658;
    second_bbox.min.values[0] = local_650;
    second_bbox.min.values[1] = local_664[0];
    second_bbox.min.values[2] = local_664[1];
    second_bbox.max.values[0] = local_65c;
    for (local_830 = local_818; local_830 < prim_ids_2;
        local_830 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    ((long)&(local_830->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i_2,
                          (size_type)local_830);
      local_7c8 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::operator[]
                            (&this->bboxes_,*pvVar9);
      local_7c0 = (Vec<float,_3UL> *)((long)&first_range.second + 4);
      local_708.f = &local_798;
      local_708.v = (Vec<float,_3UL> *)local_6ec;
      v_6.values._4_8_ = &local_708;
      local_798.a = local_7c0;
      local_798.b = &local_7c8->min;
      local_788 = local_7c8;
      local_780 = local_7c0;
      local_6f8 = local_708.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,0);
      uVar4 = v_6.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
      local_710 = v_6.values[0];
      local_718 = local_6ec;
      local_7a0 = v_6.values[0];
      local_7a8 = local_6ec;
      local_770 = v_6.values[0];
      local_778 = local_6ec;
      local_7b0 = v_6.values[0];
      local_7b8 = local_6ec;
      local_7e0 = v_6.values[0];
      local_7e8 = local_6ec;
      local_7d0 = v_6.values[0];
      local_7d8 = local_6ec;
      second_bbox.min.values[0] = v_6.values[0];
      stack0xfffffffffffff38c = local_6ec;
      local_748.a = (Vec<float,_3UL> *)(second_bbox.min.values + 1);
      local_748.b = &local_7c8->max;
      local_6b0.f = &local_748;
      local_6b0.v = (Vec<float,_3UL> *)local_694;
      v_7.values._4_8_ = &local_6b0;
      local_738 = local_748.b;
      local_730 = (float *)local_748.a;
      local_6a0 = local_6b0.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_7.values._4_8_,0);
      uVar4 = v_7.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_7.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
      local_750 = v_7.values[0];
      local_758[0] = (float)local_694._0_4_;
      local_758[1] = (float)local_694._4_4_;
      local_720 = v_7.values[0];
      local_728[0] = (float)local_694._0_4_;
      local_728[1] = (float)local_694._4_4_;
      local_760 = v_7.values[0];
      local_768[0] = (float)local_694._0_4_;
      local_768[1] = (float)local_694._4_4_;
      local_800 = v_7.values[0];
      local_808[0] = (float)local_694._0_4_;
      local_808[1] = (float)local_694._4_4_;
      local_7f4[0] = (float)local_694._0_4_;
      local_7f4[1] = (float)local_694._4_4_;
      local_7ec = v_7.values[0];
      second_bbox.min.values[1] = (float)local_694._0_4_;
      second_bbox.min.values[2] = (float)local_694._4_4_;
      second_bbox.max.values[0] = v_7.values[0];
    }
    puVar11 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_c20);
    pVar12 = std::make_pair<unsigned_long&,unsigned_long&>(&item.node_id,puVar11);
    first_range.first = pVar12.second;
    second_range.second = pVar12.first;
    puVar11 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_c20);
    pVar12 = std::make_pair<unsigned_long&,unsigned_long&>(puVar11,&item.begin);
    second_range.first = pVar12.second;
    first_item.end = pVar12.first;
    local_918.b = (Vec<float,_3UL> *)(second_bbox.max.values + 1);
    local_918.a = (Vec<float,_3UL> *)(first_bbox.min.values + 1);
    local_8d8.f = &local_918;
    local_8d8.v = (Vec<float,_3UL> *)local_8bc;
    v_8.values._4_8_ = &local_8d8;
    local_908 = (float *)local_918.b;
    local_900 = (float *)local_918.a;
    local_8c8 = local_8d8.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_8.values._4_8_,0);
    uVar4 = v_8.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_8.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_8e0 = v_8.values[0];
    local_8e8 = local_8bc;
    local_8f0 = v_8.values[0];
    local_8f8 = local_8bc;
    local_9d4 = local_8bc._0_4_;
    fStack_9d0 = local_8bc._4_4_;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)v_8.values[0]),ZEXT416((uint)(local_9d4 + fStack_9d0)),
                             ZEXT416((uint)(local_9d4 * fStack_9d0)));
    local_a70.b = (Vec<float,_3UL> *)((long)&first_range.second + 4);
    local_a70.a = (Vec<float,_3UL> *)(second_bbox.min.values + 1);
    local_a30.f = &local_a70;
    local_a30.v = (Vec<float,_3UL> *)local_a14;
    v_9.values._4_8_ = &local_a30;
    local_a60 = local_a70.b;
    local_a58 = (float *)local_a70.a;
    local_a20 = local_a30.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_9.values._4_8_,0);
    uVar4 = v_9.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_9.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar4,2);
    local_a38 = v_9.values[0];
    local_a40 = local_a14;
    local_a48 = v_9.values[0];
    local_a50 = local_a14;
    local_b2c = local_a14._0_4_;
    fStack_b28 = local_a14._4_4_;
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)v_9.values[0]),ZEXT416((uint)(local_b2c + fStack_b28)),
                             ZEXT416((uint)(local_b2c * fStack_b28)));
    if (auVar1._0_4_ < auVar2._0_4_) {
      std::swap<bvh::v2::BBox<float,3ul>>
                ((BBox<float,_3UL> *)(second_bbox.max.values + 1),
                 (BBox<float,_3UL> *)((long)&first_range.second + 4));
      std::swap<unsigned_long,unsigned_long>
                ((pair<unsigned_long,_unsigned_long> *)&second_range.second,
                 (pair<unsigned_long,_unsigned_long> *)&first_item.end);
    }
    second_item.end = stack0xfffffffffffff3c0;
    first_item.node_id = second_range.second;
    first_item.begin = first_range.first;
    local_cc8 = (undefined1  [8])(stack0xfffffffffffff3c0 + 1);
    second_item.node_id = first_item.end;
    second_item.begin = second_range.first;
    local_870.this =
         std::
         vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ::operator[](&__return_storage_ptr__->nodes,stack0xfffffffffffff3c0);
    local_870.bbox = (BBox<float,_3UL> *)(second_bbox.max.values + 1);
    local_128 = &local_870;
    local_860 = local_870.bbox;
    local_858 = local_870.this;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_128,0);
    local_110 = local_128;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_128,1);
    local_f8 = local_110;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_110,2);
    local_e0 = local_f8;
    local_890.this =
         std::
         vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ::operator[](&__return_storage_ptr__->nodes,stack0xfffffffffffff3c0 + 1);
    local_890.bbox = (BBox<float,_3UL> *)((long)&first_range.second + 4);
    local_120 = &local_890;
    local_880 = local_890.bbox;
    local_878 = local_890.this;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_120,0);
    local_118 = local_120;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_120,1);
    local_f0 = local_118;
    Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_118,2);
    local_e8 = local_f0;
    local_1d8 = &second_item.end;
    local_1e0 = local_cc8;
    if (first_item.begin - first_item.node_id < second_item.begin - second_item.node_id) {
      std::swap<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>
                ((WorkItem *)&second_item.end,(WorkItem *)local_cc8);
    }
    std::
    stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
    ::push((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
            *)local_bd8,(value_type *)&second_item.end);
    std::
    stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
    ::push((stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
            *)local_bd8,(value_type *)local_cc8);
  } while( true );
}

Assistant:

Bvh<Node> build() {
        const auto prim_count = bboxes_.size();

        Bvh<Node> bvh;
        bvh.nodes.reserve((2 * prim_count) / config_.min_leaf_size);
        bvh.nodes.emplace_back();
        bvh.nodes.back().set_bbox(compute_bbox(0, prim_count));

        std::stack<WorkItem> stack;
        stack.push(WorkItem { 0, 0, prim_count });
        while (!stack.empty()) {
            auto item = stack.top();
            stack.pop();

            auto& node = bvh.nodes[item.node_id];
            if (item.size() > config_.min_leaf_size) {
                if (auto split_pos = try_split(node.get_bbox(), item.begin, item.end)) {
                    auto first_child = bvh.nodes.size();
                    node.index = Node::Index::make_inner(first_child);

                    bvh.nodes.resize(first_child + 2);

                    auto first_bbox   = compute_bbox(item.begin, *split_pos);
                    auto second_bbox  = compute_bbox(*split_pos, item.end);
                    auto first_range  = std::make_pair(item.begin, *split_pos);
                    auto second_range = std::make_pair(*split_pos, item.end);

                    // For "any-hit" queries, the left child is chosen first, so we make sure that
                    // it is the child with the largest area, as it is more likely to contain an
                    // an occluder. See "SATO: Surface Area Traversal Order for Shadow Ray Tracing",
                    // by J. Nah and D. Manocha.
                    if (first_bbox.get_half_area() < second_bbox.get_half_area()) {
                        std::swap(first_bbox, second_bbox);
                        std::swap(first_range, second_range);
                    }

                    auto first_item  = WorkItem { first_child + 0, first_range.first, first_range.second };
                    auto second_item = WorkItem { first_child + 1, second_range.first, second_range.second };
                    bvh.nodes[first_child + 0].set_bbox(first_bbox);
                    bvh.nodes[first_child + 1].set_bbox(second_bbox);

                    // Process the largest child item first, in order to minimize the stack size.
                    if (first_item.size() < second_item.size())
                        std::swap(first_item, second_item);

                    stack.push(first_item);
                    stack.push(second_item);
                    continue;
                }
            }

            node.index = Node::Index::make_leaf(item.begin, item.size());
        }

        bvh.prim_ids = std::move(get_prim_ids());
        bvh.nodes.shrink_to_fit();
        return bvh;
    }